

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

void __thiscall BailOutRecord::Dump(BailOutRecord *this)

{
  uint count;
  uint local_18;
  uint startCallOutParamCount;
  uint i;
  uint outParamSlot;
  BailOutRecord *this_local;
  
  if (this->localOffsetsCount != 0) {
    Output::Print(L"**** Locals ***\n");
    DumpLocalOffsets(this,this->localOffsetsCount,0);
  }
  startCallOutParamCount = 0;
  if (this->argOutOffsetInfo != (ArgOutOffsetInfo *)0x0) {
    Output::Print(L"**** Out params ***\n");
    for (local_18 = 0; local_18 < this->argOutOffsetInfo->startCallCount; local_18 = local_18 + 1) {
      count = this->argOutOffsetInfo->startCallOutParamCounts[local_18];
      DumpArgOffsets(this,count,this->argOutOffsetInfo->outParamOffsets + startCallOutParamCount,
                     this->argOutOffsetInfo->argOutSymStart + startCallOutParamCount);
      startCallOutParamCount = count + startCallOutParamCount;
    }
  }
  return;
}

Assistant:

void BailOutRecord::Dump()
{
    if (this->localOffsetsCount)
    {
        Output::Print(_u("**** Locals ***\n"));
        DumpLocalOffsets(this->localOffsetsCount, 0);
    }

    uint outParamSlot = 0;
    if(this->argOutOffsetInfo)
    {
        Output::Print(_u("**** Out params ***\n"));
        for (uint i = 0; i < this->argOutOffsetInfo->startCallCount; i++)
        {
            uint startCallOutParamCount = this->argOutOffsetInfo->startCallOutParamCounts[i];
            DumpArgOffsets(startCallOutParamCount, &this->argOutOffsetInfo->outParamOffsets[outParamSlot], this->argOutOffsetInfo->argOutSymStart + outParamSlot);
            outParamSlot += startCallOutParamCount;
        }
    }
}